

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SwapChainVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::SwapChainVkImpl::CreateVulkanSwapChain(SwapChainVkImpl *this)

{
  Uint32 *pUVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  uint uVar4;
  VkPhysicalDevice pVVar5;
  VkSwapchainKHR pVVar6;
  VkDevice pVVar7;
  pointer pRVar8;
  RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
  RVar9;
  RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
  *pRVar10;
  undefined8 uVar11;
  TEXTURE_FORMAT Format;
  VkResult VVar12;
  VkFormat VVar13;
  VkSurfaceTransformFlagBitsKHR VVar14;
  SURFACE_TRANSFORM SVar15;
  SWAP_CHAIN_USAGE_FLAGS SVar16;
  TextureFormatAttribs *pTVar17;
  __normal_iterator<VkPresentModeKHR_*,_std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>_>
  _Var18;
  VkSurfaceFormatKHR *SrfFmt_1;
  char (*Args_1) [16];
  char (*Args_1_00) [39];
  VkSurfaceFormatKHR *pVVar19;
  char (*Args_1_01) [21];
  char (*Args_1_02) [164];
  char (*Args_1_03) [24];
  VkColorSpaceKHR VVar20;
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  *this_00;
  VkSurfaceFormatKHR *SrfFmt;
  long lVar21;
  char *in_R8;
  char *in_R9;
  VkPresentModeKHR VVar22;
  VkPresentModeKHR *pVVar23;
  Uint32 UVar24;
  VkExtent2D VVar25;
  ulong uVar26;
  undefined4 uVar27;
  Uint32 UVar28;
  uint32_t swapchainImageCount;
  uint32_t formatCount;
  uint32_t presentModeCount;
  string Name;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> presentModes;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> PreferredPresentModes;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> SupportedFormats;
  VkSurfaceCapabilitiesKHR surfCapabilities;
  string msg;
  SemaphoreWrapper Semaphore;
  string *in_stack_fffffffffffffcc8;
  string *psVar29;
  uint *in_stack_fffffffffffffcd0;
  uint32_t local_324;
  uint32_t local_320;
  uint32_t local_31c;
  ios_base *local_318;
  RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
  local_310;
  RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
  *local_308;
  long *local_300 [2];
  long local_2f0 [2];
  element_type *local_2e0;
  RenderDeviceVkImpl *local_2d8;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> local_2d0;
  undefined1 local_2b8 [16];
  VkPresentModeKHR *local_2a8;
  VkSurfaceKHR pVStack_2a0;
  uint local_298;
  VkFormat VStack_294;
  VkColorSpaceKHR VStack_290;
  Uint32 UStack_28c;
  Uint32 local_288;
  uint32_t uStack_284;
  uint uStack_280;
  VkSharingMode VStack_27c;
  uint32_t uStack_278;
  undefined4 uStack_274;
  uint32_t *puStack_270;
  VkSurfaceTransformFlagBitsKHR local_268;
  VkCompositeAlphaFlagBitsKHR local_264;
  VkPresentModeKHR local_260;
  VkBool32 local_25c;
  VkSwapchainKHR local_258;
  vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_> local_250;
  undefined1 local_238 [8];
  VkExtent2D VStack_230;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_228;
  undefined8 local_218;
  undefined8 uStack_210;
  VkImageUsageFlags local_208;
  undefined1 local_200 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [7];
  ios_base local_180 [264];
  VkSemaphoreCreateInfo local_78;
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  *local_58;
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  *local_50;
  SemaphoreWrapper local_48;
  
  local_2d8 = RefCntAutoPtr<Diligent::IRenderDevice>::RawPtr<Diligent::RenderDeviceVkImpl>
                        (&(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_pRenderDevice);
  pVVar5 = ((local_2d8->m_PhysicalDevice)._M_t.
            super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            ._M_t.
            super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
            .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>._M_head_impl)->
           m_VkDevice;
  local_320 = 0;
  Args_1 = (char (*) [16])0x0;
  VVar12 = (*vkGetPhysicalDeviceSurfaceFormatsKHR)
                     (pVVar5,this->m_VkSurface,&local_320,(VkSurfaceFormatKHR *)0x0);
  if (VVar12 != VK_SUCCESS) {
    local_200._0_8_ = VulkanUtilities::VkResultToString(VVar12);
    in_stack_fffffffffffffcc8 = (string *)local_200;
    in_R8 = "Failed to query number of supported formats";
    in_R9 = "\nVK Error Code: ";
    Args_1 = (char (*) [16])0xac;
    LogError<true,char[44],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xac,(char (*) [44])"Failed to query number of supported formats",
               (char (*) [17])"\nVK Error Code: ",(char **)in_stack_fffffffffffffcc8);
  }
  if (local_320 == 0) {
    FormatString<char[26],char[16]>
              ((string *)local_200,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"formatCount > 0",Args_1);
    DebugAssertionFailed
              ((Char *)local_200._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xad);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &((string *)local_200)->field_2) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
  }
  psVar29 = (string *)local_200;
  std::vector<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::vector
            (&local_250,(ulong)local_320,(allocator_type *)psVar29);
  VVar12 = (*vkGetPhysicalDeviceSurfaceFormatsKHR)
                     (pVVar5,this->m_VkSurface,&local_320,
                      local_250.
                      super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  if (VVar12 != VK_SUCCESS) {
    local_200._0_8_ = VulkanUtilities::VkResultToString(VVar12);
    in_R8 = "Failed to query supported format properties";
    in_R9 = "\nVK Error Code: ";
    in_stack_fffffffffffffcc8 = psVar29;
    LogError<true,char[44],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xb0,(char (*) [44])"Failed to query supported format properties",
               (char (*) [17])"\nVK Error Code: ",(char **)psVar29);
  }
  Args_1_00 = (char (*) [39])
              ((long)local_250.
                     super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_250.
                     super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3);
  if (Args_1_00 != (char (*) [39])(ulong)local_320) {
    FormatString<char[26],char[39]>
              ((string *)local_200,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"formatCount == SupportedFormats.size()",Args_1_00);
    DebugAssertionFailed
              ((Char *)local_200._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xb1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &((string *)local_200)->field_2) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
  }
  VVar13 = TexFormatToVkFormat((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                               ColorBufferFormat);
  this->m_VkColorFormat = VVar13;
  pVVar19 = local_250.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if ((local_320 != 1) ||
     ((local_250.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl
       .super__Vector_impl_data._M_start)->format != VK_FORMAT_UNDEFINED)) {
    for (; pVVar19 !=
           local_250.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
           _M_impl.super__Vector_impl_data._M_finish; pVVar19 = pVVar19 + 1) {
      if (pVVar19->format == VVar13) {
        VVar20 = pVVar19->colorSpace;
        goto LAB_0025f0a3;
      }
    }
    pVVar19 = local_250.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((int)VVar13 < 0x2c) {
      if (VVar13 == VK_FORMAT_R8G8B8A8_UNORM) {
        VVar13 = VK_FORMAT_B8G8R8A8_UNORM;
      }
      else if (VVar13 == VK_FORMAT_R8G8B8A8_SRGB) {
        VVar13 = VK_FORMAT_B8G8R8A8_SRGB;
      }
      else {
LAB_0025ef7c:
        VVar13 = VK_FORMAT_UNDEFINED;
      }
    }
    else if (VVar13 == VK_FORMAT_B8G8R8A8_SRGB) {
      VVar13 = VK_FORMAT_R8G8B8A8_SRGB;
    }
    else {
      if (VVar13 != VK_FORMAT_B8G8R8A8_UNORM) goto LAB_0025ef7c;
      VVar13 = VK_FORMAT_R8G8B8A8_UNORM;
    }
    for (; pVVar19 !=
           local_250.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
           _M_impl.super__Vector_impl_data._M_finish; pVVar19 = pVVar19 + 1) {
      if (pVVar19->format == VVar13) {
        VVar20 = pVVar19->colorSpace;
        this->m_VkColorFormat = VVar13;
        Format = VkFormatToTexFormat(VVar13);
        pTVar17 = GetTextureFormatAttribs
                            ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                             ColorBufferFormat);
        in_R8 = (char *)GetTextureFormatAttribs(Format);
        FormatString<char[31],char_const*,char[60],char_const*>
                  ((string *)local_200,(Diligent *)"Requested color buffer format ",
                   (char (*) [31])pTVar17,
                   (char **)" is not supported by the surface and will be replaced with ",
                   (char (*) [60])in_R8,(char **)in_R9);
        if (DebugMessageCallback != (undefined *)0x0) {
          in_R8 = (char *)0x0;
          (*(code *)DebugMessageCallback)(0,local_200._0_8_,0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_200._0_8_ != &((string *)local_200)->field_2) {
          operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
        }
        (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.ColorBufferFormat =
             Format;
        goto LAB_0025f0a3;
      }
    }
    pTVar17 = GetTextureFormatAttribs
                        ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.
                         ColorBufferFormat);
    FormatString<char[31],char_const*,char[32]>
              ((string *)local_200,(Diligent *)"Requested color buffer format ",
               (char (*) [31])pTVar17,(char **)"is not supported by the surface",
               (char (*) [32])in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char *)0x0;
      (*(code *)DebugMessageCallback)(1,local_200._0_8_,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &((string *)local_200)->field_2) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
  }
  VVar20 = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
LAB_0025f0a3:
  local_218._0_4_ = 0;
  local_218._4_4_ = 0;
  uStack_210._0_4_ = 0;
  uStack_210._4_4_ = 0;
  local_228._M_allocated_capacity._0_4_ = 0;
  local_228._M_allocated_capacity._4_4_ = 0;
  local_228._8_4_ = 0;
  local_228._12_4_ = 0;
  local_238 = (undefined1  [8])0x0;
  VStack_230.width = 0;
  VStack_230.height = 0;
  local_208 = 0;
  VVar12 = (*vkGetPhysicalDeviceSurfaceCapabilitiesKHR)
                     (pVVar5,this->m_VkSurface,(VkSurfaceCapabilitiesKHR *)local_238);
  if (VVar12 != VK_SUCCESS) {
    local_200._0_8_ = VulkanUtilities::VkResultToString(VVar12);
    in_R8 = "Failed to query physical device surface capabilities";
    in_stack_fffffffffffffcc8 = psVar29;
    LogError<true,char[53],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf3,(char (*) [53])"Failed to query physical device surface capabilities",
               (char (*) [17])"\nVK Error Code: ",(char **)psVar29);
  }
  local_31c = 0;
  Args_1_01 = (char (*) [21])0x0;
  VVar12 = (*vkGetPhysicalDeviceSurfacePresentModesKHR)
                     (pVVar5,this->m_VkSurface,&local_31c,(VkPresentModeKHR *)0x0);
  if (VVar12 != VK_SUCCESS) {
    local_200._0_8_ = VulkanUtilities::VkResultToString(VVar12);
    in_R8 = "Failed to query surface present mode count";
    Args_1_01 = (char (*) [21])0xf8;
    LogError<true,char[43],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf8,(char (*) [43])"Failed to query surface present mode count",
               (char (*) [17])"\nVK Error Code: ",(char **)psVar29);
    in_stack_fffffffffffffcc8 = psVar29;
  }
  if (local_31c == 0) {
    FormatString<char[26],char[21]>
              ((string *)local_200,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"presentModeCount > 0",Args_1_01);
    DebugAssertionFailed
              ((Char *)local_200._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xf9);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &((string *)local_200)->field_2) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
  }
  psVar29 = (string *)local_200;
  std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::vector
            (&local_2d0,(ulong)local_31c,(allocator_type *)psVar29);
  VVar12 = (*vkGetPhysicalDeviceSurfacePresentModesKHR)
                     (pVVar5,this->m_VkSurface,&local_31c,
                      local_2d0.
                      super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                      _M_impl.super__Vector_impl_data._M_start);
  if (VVar12 != VK_SUCCESS) {
    local_200._0_8_ = VulkanUtilities::VkResultToString(VVar12);
    in_R8 = "Failed to query surface present modes";
    LogError<true,char[38],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xfc,(char (*) [38])"Failed to query surface present modes",
               (char (*) [17])"\nVK Error Code: ",(char **)psVar29);
    in_stack_fffffffffffffcc8 = psVar29;
  }
  Args_1_02 = (char (*) [164])
              ((long)local_2d0.
                     super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl
                     .super__Vector_impl_data._M_finish -
               (long)local_2d0.
                     super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl
                     .super__Vector_impl_data._M_start >> 2);
  if (Args_1_02 != (char (*) [164])(ulong)local_31c) {
    FormatString<char[26],char[40]>
              ((string *)local_200,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"presentModeCount == presentModes.size()",(char (*) [40])Args_1_02);
    Args_1_02 = (char (*) [164])0xfd;
    DebugAssertionFailed
              ((Char *)local_200._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0xfd);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &((string *)local_200)->field_2) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
  }
  local_2e0 = (element_type *)CONCAT44(local_2e0._4_4_,VVar20);
  SVar15 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform;
  if (SVar15 == SURFACE_TRANSFORM_OPTIMAL) {
LAB_0025f368:
    VVar14 = (VkSurfaceTransformFlagBitsKHR)uStack_210;
    SVar15 = VkSurfaceTransformFlagToSurfaceTransform((VkSurfaceTransformFlagBitsKHR)uStack_210);
    (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.PreTransform = SVar15;
    local_2b8._0_8_ = GetSurfaceTransformString(SVar15);
    FormatString<char[7],char_const*,char[25]>
              ((string *)local_200,(Diligent *)"Using ",(char (*) [7])local_2b8,
               (char **)" swap chain pretransform",(char (*) [25])in_R8);
    if (DebugMessageCallback != (undefined *)0x0) {
      in_R8 = (char *)0x0;
      (*(code *)DebugMessageCallback)(0,local_200._0_8_,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != &((string *)local_200)->field_2) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
  }
  else {
    VVar14 = SurfaceTransformToVkSurfaceTransformFlag(SVar15);
    if ((local_218._4_4_ & VVar14) == 0) {
      local_2b8._0_8_ =
           GetSurfaceTransformString
                     ((this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform);
      FormatString<char_const*,char[164]>
                ((string *)local_200,(Diligent *)local_2b8,
                 (char **)
                 " is not supported by the presentation engine. Optimal surface transform will be used instead. Query the swap chain description to get the actual surface transform."
                 ,Args_1_02);
      if (DebugMessageCallback != (undefined *)0x0) {
        in_R8 = (char *)0x0;
        (*(code *)DebugMessageCallback)(1,local_200._0_8_,0,0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._0_8_ != &((string *)local_200)->field_2) {
        operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
      }
      (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform =
           SURFACE_TRANSFORM_OPTIMAL;
      goto LAB_0025f368;
    }
    SVar15 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_DesiredPreTransform;
    (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.PreTransform = SVar15;
    if (SVar15 == SURFACE_TRANSFORM_OPTIMAL) goto LAB_0025f368;
  }
  uVar3 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width;
  if ((uVar3 == 0 || VStack_230.width != 0xffffffff) ||
     (uVar4 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height, uVar4 == 0
     )) {
    VVar25 = VStack_230;
    uVar27 = VStack_230.height;
  }
  else {
    uVar27 = local_228._M_allocated_capacity._0_4_;
    if ((uint)local_228._M_allocated_capacity._0_4_ < uVar3) {
      uVar27 = uVar3;
    }
    if ((uint)local_228._8_4_ < (uint)uVar27) {
      uVar27 = local_228._8_4_;
    }
    VVar25.height = 0;
    VVar25.width = uVar27;
    uVar27 = local_228._M_allocated_capacity._4_4_;
    if ((uint)local_228._M_allocated_capacity._4_4_ < uVar4) {
      uVar27 = uVar4;
    }
    if ((uint)local_228._12_4_ < (uint)uVar27) {
      uVar27 = local_228._12_4_;
    }
  }
  UVar24 = VVar25.width + (uint)(VVar25.width == 0);
  UVar28 = uVar27 + (uint)(uVar27 == 0);
  (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Width = UVar24;
  (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Height = UVar28;
  local_2b8._0_8_ = (VkPresentModeKHR *)0x0;
  local_2b8._8_8_ = (VkPresentModeKHR *)0x0;
  local_2a8 = (VkPresentModeKHR *)0x0;
  local_318 = (ios_base *)CONCAT44(local_318._4_4_,VVar14);
  if (this->m_VSyncEnabled == true) {
    local_200._0_4_ = 3;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
    _M_realloc_insert<VkPresentModeKHR>
              ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_2b8,
               (iterator)0x0,(VkPresentModeKHR *)local_200);
    local_200._0_4_ = 2;
    if ((VkPresentModeKHR *)local_2b8._8_8_ == local_2a8) {
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
      _M_realloc_insert<VkPresentModeKHR>
                ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_2b8,
                 (iterator)local_2b8._8_8_,(VkPresentModeKHR *)local_200);
      goto LAB_0025f58d;
    }
  }
  else {
    local_200._0_4_ = 1;
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
    _M_realloc_insert<VkPresentModeKHR>
              ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_2b8,
               (iterator)0x0,(VkPresentModeKHR *)local_200);
    local_200._0_4_ = 0;
    if ((VkPresentModeKHR *)local_2b8._8_8_ == local_2a8) {
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
      _M_realloc_insert<VkPresentModeKHR>
                ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_2b8,
                 (iterator)local_2b8._8_8_,(VkPresentModeKHR *)local_200);
    }
    else {
      *(VkPresentModeKHR *)local_2b8._8_8_ = VK_PRESENT_MODE_IMMEDIATE_KHR;
      local_2b8._8_8_ = local_2b8._8_8_ + 4;
    }
    local_200._0_4_ = 2;
    if ((VkPresentModeKHR *)local_2b8._8_8_ == local_2a8) {
      std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::
      _M_realloc_insert<VkPresentModeKHR>
                ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)local_2b8,
                 (iterator)local_2b8._8_8_,(VkPresentModeKHR *)local_200);
      goto LAB_0025f58d;
    }
  }
  *(VkPresentModeKHR *)local_2b8._8_8_ = VK_PRESENT_MODE_FIFO_KHR;
  local_2b8._8_8_ = local_2b8._8_8_ + 4;
LAB_0025f58d:
  uVar11 = local_2b8._8_8_;
  if (local_2b8._0_8_ != local_2b8._8_8_) {
    pVVar23 = (VkPresentModeKHR *)local_2b8._0_8_;
    do {
      local_200._0_4_ = *pVVar23;
      _Var18 = std::
               __find_if<__gnu_cxx::__normal_iterator<VkPresentModeKHR*,std::vector<VkPresentModeKHR,std::allocator<VkPresentModeKHR>>>,__gnu_cxx::__ops::_Iter_equals_val<VkPresentModeKHR_const>>
                         (local_2d0.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          local_2d0.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_finish,(string *)local_200);
      if (_Var18._M_current !=
          local_2d0.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        switch(local_200._0_8_ & 0xffffffff) {
        case 0:
          local_300[0] = (long *)0x6c2ac2;
          VVar22 = VK_PRESENT_MODE_IMMEDIATE_KHR;
          goto LAB_0025f5f0;
        case 1:
          local_300[0] = (long *)0x6c2ae0;
          VVar22 = VK_PRESENT_MODE_MAILBOX_KHR;
          goto LAB_0025f5f0;
        case 2:
          goto switchD_0025fdaa_caseD_2;
        case 3:
          local_300[0] = (long *)0x6c2b15;
          VVar22 = VK_PRESENT_MODE_FIFO_RELAXED_KHR;
          goto LAB_0025f5f0;
        default:
          if (local_200._0_4_ == VK_PRESENT_MODE_SHARED_DEMAND_REFRESH_KHR) {
            local_300[0] = (long *)0x6c2b36;
            VVar22 = VK_PRESENT_MODE_SHARED_DEMAND_REFRESH_KHR;
          }
          else if (local_200._0_4_ == VK_PRESENT_MODE_SHARED_CONTINUOUS_REFRESH_KHR) {
            local_300[0] = (long *)0x6c2b60;
            VVar22 = VK_PRESENT_MODE_SHARED_CONTINUOUS_REFRESH_KHR;
          }
          else {
            local_300[0] = (long *)0x6c2b8e;
            VVar22 = local_200._0_4_;
          }
          goto LAB_0025f5f0;
        }
      }
      pVVar23 = pVVar23 + 1;
    } while (pVVar23 != (VkPresentModeKHR *)uVar11);
  }
switchD_0025fdaa_caseD_2:
  local_300[0] = (long *)0x6c2afc;
  VVar22 = VK_PRESENT_MODE_FIFO_KHR;
LAB_0025f5f0:
  FormatString<char[7],char_const*,char[25]>
            ((string *)local_200,(Diligent *)"Using ",(char (*) [7])local_300,
             (char **)" swap chain present mode",(char (*) [25])in_R8);
  if (DebugMessageCallback != (undefined *)0x0) {
    (*(code *)DebugMessageCallback)(0,local_200._0_8_,0,0,0);
  }
  paVar2 = &((string *)local_200)->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._0_8_ != paVar2) {
    operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
  }
  if ((VkPresentModeKHR *)local_2b8._0_8_ != (VkPresentModeKHR *)0x0) {
    operator_delete((void *)local_2b8._0_8_,(long)local_2a8 - local_2b8._0_8_);
  }
  pUVar1 = &this->m_DesiredBufferCount;
  local_298 = this->m_DesiredBufferCount;
  if (this->m_DesiredBufferCount < (uint)local_238._0_4_) {
    in_stack_fffffffffffffcc8 = (string *)local_238;
    FormatString<char[28],unsigned_int,char[71],unsigned_int,char[17],unsigned_int>
              ((string *)local_200,(Diligent *)"Desired back buffer count (",(char (*) [28])pUVar1,
               (uint *)") is smaller than the minimal image count supported for this surface (",
               (char (*) [71])in_stack_fffffffffffffcc8,(uint *)"). Resetting to ",
               (char (*) [17])in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_200._0_8_,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
    *pUVar1 = local_238._0_4_;
    local_298 = local_238._0_4_;
  }
  if ((uint)local_238._4_4_ < local_298 && local_238._4_4_ != 0) {
    in_stack_fffffffffffffcc8 = (string *)(local_238 + 4);
    FormatString<char[28],unsigned_int,char[71],unsigned_int,char[17],unsigned_int>
              ((string *)local_200,(Diligent *)"Desired back buffer count (",(char (*) [28])pUVar1,
               (uint *)") is greater than the maximal image count supported for this surface (",
               (char (*) [71])in_stack_fffffffffffffcc8,(uint *)"). Resetting to ",
               (char (*) [17])in_stack_fffffffffffffcc8,in_stack_fffffffffffffcd0);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_200._0_8_,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
    *pUVar1 = local_238._4_4_;
    local_298 = local_238._4_4_;
  }
  lVar21 = 0;
  do {
    local_264 = *(VkCompositeAlphaFlagBitsKHR *)((long)&DAT_006c2470 + lVar21);
    if ((local_264 & uStack_210._4_4_) != 0) goto LAB_0025f7b0;
    lVar21 = lVar21 + 4;
  } while (lVar21 != 0x10);
  local_264 = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
LAB_0025f7b0:
  pVVar6 = this->m_VkSwapChain;
  this->m_VkSwapChain = (VkSwapchainKHR)0x0;
  local_2b8._8_8_ = (pointer)0x0;
  uStack_278 = 0;
  uStack_274 = 0;
  puStack_270 = (uint32_t *)0x0;
  uStack_280 = 0;
  VStack_27c = VK_SHARING_MODE_EXCLUSIVE;
  local_2a8 = (pointer)0x0;
  local_2b8._0_8_ = (pointer)0x3b9acde8;
  pVStack_2a0 = this->m_VkSurface;
  VStack_294 = this->m_VkColorFormat;
  local_268 = (VkSurfaceTransformFlagBitsKHR)local_318;
  uStack_284 = 1;
  local_288 = UVar28;
  local_25c = 1;
  UStack_28c = UVar24;
  VStack_290 = (VkColorSpaceKHR)local_2e0;
  SVar16 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage;
  psVar29 = (string *)local_200;
  local_260 = VVar22;
  local_258 = pVVar6;
  if (SVar16 == SWAP_CHAIN_USAGE_NONE) {
    FormatString<char[34]>((string *)local_200,(char (*) [34])"No swap chain usage flags defined");
    DebugAssertionFailed
              ((Char *)local_200._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1b4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
    SVar16 = (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.Usage;
  }
  if ((SVar16 & SWAP_CHAIN_USAGE_RENDER_TARGET) != SWAP_CHAIN_USAGE_NONE) {
    uStack_280 = uStack_280 | 0x12;
  }
  if ((SVar16 & SWAP_CHAIN_USAGE_SHADER_RESOURCE) != SWAP_CHAIN_USAGE_NONE) {
    uStack_280 = uStack_280 | 4;
  }
  if ((SVar16 & SWAP_CHAIN_USAGE_INPUT_ATTACHMENT) != SWAP_CHAIN_USAGE_NONE) {
    uStack_280 = uStack_280 | 0x80;
  }
  if ((SVar16 & SWAP_CHAIN_USAGE_COPY_SOURCE) != SWAP_CHAIN_USAGE_NONE) {
    uStack_280 = uStack_280 | 1;
  }
  VStack_27c = VK_SHARING_MODE_EXCLUSIVE;
  uStack_278 = 0;
  puStack_270 = (uint32_t *)0x0;
  local_2e0 = (local_2d8->m_LogicalVkDevice).
              super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr;
  pVVar7 = local_2e0->m_VkDevice;
  VVar12 = (*vkCreateSwapchainKHR)
                     (pVVar7,(VkSwapchainCreateInfoKHR *)local_2b8,(VkAllocationCallbacks *)0x0,
                      &this->m_VkSwapChain);
  if (VVar12 != VK_SUCCESS) {
    local_200._0_8_ = VulkanUtilities::VkResultToString(VVar12);
    in_stack_fffffffffffffcc8 = psVar29;
    LogError<true,char[34],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1d3,(char (*) [34])"Failed to create Vulkan swapchain",
               (char (*) [17])"\nVK Error Code: ",(char **)psVar29);
  }
  if (pVVar6 != (VkSwapchainKHR)0x0) {
    (*vkDestroySwapchainKHR)(pVVar7,pVVar6,(VkAllocationCallbacks *)0x0);
  }
  local_324 = 0;
  Args_1_03 = (char (*) [24])0x0;
  VVar12 = (*vkGetSwapchainImagesKHR)(pVVar7,this->m_VkSwapChain,&local_324,(VkImage *)0x0);
  if (VVar12 != VK_SUCCESS) {
    local_200._0_8_ = VulkanUtilities::VkResultToString(VVar12);
    Args_1_03 = (char (*) [24])0x1de;
    LogError<true,char[41],char[17],char_const*>
              (false,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1de,(char (*) [41])"Failed to request swap chain image count",
               (char (*) [17])"\nVK Error Code: ",(char **)psVar29);
    in_stack_fffffffffffffcc8 = psVar29;
  }
  if (local_324 == 0) {
    FormatString<char[26],char[24]>
              ((string *)local_200,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"swapchainImageCount > 0",Args_1_03);
    DebugAssertionFailed
              ((Char *)local_200._0_8_,"CreateVulkanSwapChain",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/SwapChainVkImpl.cpp"
               ,0x1df);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
  }
  if (local_324 != (this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount)
  {
    pUVar1 = &(this->super_SwapChainBase<Diligent::ISwapChainVk>).m_SwapChainDesc.BufferCount;
    FormatString<char[25],unsigned_int,char[12],unsigned_int,char[12]>
              ((string *)local_200,(Diligent *)"Created swap chain with ",(char (*) [25])&local_324,
               (uint *)" images vs ",(char (*) [12])pUVar1,(uint *)0x6e885f,
               (char (*) [12])in_stack_fffffffffffffcc8);
    if (DebugMessageCallback != (undefined *)0x0) {
      (*(code *)DebugMessageCallback)(0,local_200._0_8_,0,0,0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._0_8_ != paVar2) {
      operator_delete((void *)local_200._0_8_,local_1f0[0]._M_allocated_capacity + 1);
    }
    *pUVar1 = local_324;
  }
  local_50 = &this->m_ImageAcquiredSemaphores;
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::resize(local_50,(ulong)local_324);
  this_00 = &this->m_DrawCompleteSemaphores;
  std::
  vector<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
  ::resize(this_00,(ulong)local_324);
  local_58 = this_00;
  if (local_324 != 0) {
    local_318 = local_180;
    lVar21 = 0;
    uVar26 = 0;
    do {
      local_78.pNext = (void *)0x0;
      local_78.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
      local_78._4_4_ = 0;
      local_78.flags = 0;
      local_78._20_4_ = 0;
      std::__cxx11::stringstream::stringstream((stringstream *)local_200);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((string *)local_200)->field_2,"Swap chain image acquired semaphore ",
                 0x24);
      std::ostream::_M_insert<unsigned_long>((ulong)&((string *)local_200)->field_2);
      std::__cxx11::stringbuf::str();
      VulkanUtilities::VulkanLogicalDevice::CreateSemaphore
                (&local_48,local_2e0,&local_78,(char *)local_300[0]);
      pRVar8 = (local_50->
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_310.m_pObject =
           *(ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
             **)((long)&pRVar8->m_pObject + lVar21);
      local_308 = (RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
                   *)((long)&pRVar8->m_pObject + lVar21);
      ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
      ::Create(local_2d8,&local_48,(char *)local_300[0],&local_310.m_pObject);
      pRVar10 = local_308;
      RVar9.m_pObject = local_310.m_pObject;
      if ((local_308 !=
           (RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
            *)0x0) && (local_308->m_pObject != local_310.m_pObject)) {
        RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
        ::Release(local_308);
        pRVar10->m_pObject = RVar9.m_pObject;
      }
      VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>
      ::~VulkanObjectWrapper(&local_48);
      if (local_300[0] != local_2f0) {
        operator_delete(local_300[0],local_2f0[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_200);
      std::ios_base::~ios_base(local_318);
      std::__cxx11::stringstream::stringstream((stringstream *)local_200);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&((string *)local_200)->field_2,"Swap chain draw complete semaphore ",
                 0x23);
      std::ostream::_M_insert<unsigned_long>((ulong)&((string *)local_200)->field_2);
      std::__cxx11::stringbuf::str();
      VulkanUtilities::VulkanLogicalDevice::CreateSemaphore
                (&local_48,local_2e0,&local_78,(char *)local_300[0]);
      pRVar8 = (local_58->
               super__Vector_base<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>,_std::allocator<Diligent::RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_310.m_pObject =
           *(ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
             **)((long)&pRVar8->m_pObject + lVar21);
      local_308 = (RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
                   *)((long)&pRVar8->m_pObject + lVar21);
      ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>
      ::Create(local_2d8,&local_48,(char *)local_300[0],&local_310.m_pObject);
      pRVar10 = local_308;
      RVar9.m_pObject = local_310.m_pObject;
      if ((local_308 !=
           (RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
            *)0x0) && (local_308->m_pObject != local_310.m_pObject)) {
        RefCntAutoPtr<Diligent::ManagedVulkanObject<VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>_>_>
        ::Release(local_308);
        pRVar10->m_pObject = RVar9.m_pObject;
      }
      VulkanUtilities::VulkanObjectWrapper<VkSemaphore_T_*,_(VulkanUtilities::VulkanHandleTypeId)17>
      ::~VulkanObjectWrapper(&local_48);
      if (local_300[0] != local_2f0) {
        operator_delete(local_300[0],local_2f0[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_200);
      std::ios_base::~ios_base(local_318);
      uVar26 = uVar26 + 1;
      lVar21 = lVar21 + 8;
    } while (uVar26 < local_324);
  }
  if (local_2d0.super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (VkPresentModeKHR *)0x0) {
    operator_delete(local_2d0.
                    super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2d0.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2d0.
                          super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_250.super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>._M_impl.
      super__Vector_impl_data._M_start != (VkSurfaceFormatKHR *)0x0) {
    operator_delete(local_250.
                    super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_250.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_250.
                          super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void SwapChainVkImpl::CreateVulkanSwapChain()
{
    RenderDeviceVkImpl*                          pRenderDeviceVk = m_pRenderDevice.RawPtr<RenderDeviceVkImpl>();
    const VulkanUtilities::VulkanPhysicalDevice& PhysicalDevice  = pRenderDeviceVk->GetPhysicalDevice();
    VkPhysicalDevice                             vkDeviceHandle  = PhysicalDevice.GetVkDeviceHandle();
    // Get the list of VkFormats that are supported:
    uint32_t formatCount = 0;

    VkResult err = vkGetPhysicalDeviceSurfaceFormatsKHR(vkDeviceHandle, m_VkSurface, &formatCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query number of supported formats");
    VERIFY_EXPR(formatCount > 0);
    std::vector<VkSurfaceFormatKHR> SupportedFormats(formatCount);
    err = vkGetPhysicalDeviceSurfaceFormatsKHR(vkDeviceHandle, m_VkSurface, &formatCount, SupportedFormats.data());
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query supported format properties");
    VERIFY_EXPR(formatCount == SupportedFormats.size());
    m_VkColorFormat = TexFormatToVkFormat(m_SwapChainDesc.ColorBufferFormat);

    VkColorSpaceKHR ColorSpace = VK_COLORSPACE_SRGB_NONLINEAR_KHR;
    if (formatCount == 1 && SupportedFormats[0].format == VK_FORMAT_UNDEFINED)
    {
        // If the format list includes just one entry of VK_FORMAT_UNDEFINED,
        // the surface has no preferred format.  Otherwise, at least one
        // supported format will be returned.

        // Do nothing
    }
    else
    {
        bool FmtFound = false;
        for (const VkSurfaceFormatKHR& SrfFmt : SupportedFormats)
        {
            if (SrfFmt.format == m_VkColorFormat)
            {
                FmtFound   = true;
                ColorSpace = SrfFmt.colorSpace;
                break;
            }
        }
        if (!FmtFound)
        {
            VkFormat VkReplacementColorFormat = VK_FORMAT_UNDEFINED;
            switch (m_VkColorFormat)
            {
                    // clang-format off
                case VK_FORMAT_R8G8B8A8_UNORM: VkReplacementColorFormat = VK_FORMAT_B8G8R8A8_UNORM; break;
                case VK_FORMAT_B8G8R8A8_UNORM: VkReplacementColorFormat = VK_FORMAT_R8G8B8A8_UNORM; break;
                case VK_FORMAT_B8G8R8A8_SRGB:  VkReplacementColorFormat = VK_FORMAT_R8G8B8A8_SRGB;  break;
                case VK_FORMAT_R8G8B8A8_SRGB:  VkReplacementColorFormat = VK_FORMAT_B8G8R8A8_SRGB;  break;
                default: VkReplacementColorFormat = VK_FORMAT_UNDEFINED;
                    // clang-format on
            }

            bool ReplacementFmtFound = false;
            for (const VkSurfaceFormatKHR& SrfFmt : SupportedFormats)
            {
                if (SrfFmt.format == VkReplacementColorFormat)
                {
                    ReplacementFmtFound = true;
                    ColorSpace          = SrfFmt.colorSpace;
                    break;
                }
            }

            if (ReplacementFmtFound)
            {
                m_VkColorFormat                     = VkReplacementColorFormat;
                TEXTURE_FORMAT NewColorBufferFormat = VkFormatToTexFormat(VkReplacementColorFormat);
                LOG_INFO_MESSAGE("Requested color buffer format ", GetTextureFormatAttribs(m_SwapChainDesc.ColorBufferFormat).Name, " is not supported by the surface and will be replaced with ", GetTextureFormatAttribs(NewColorBufferFormat).Name);
                m_SwapChainDesc.ColorBufferFormat = NewColorBufferFormat;
            }
            else
            {
                LOG_WARNING_MESSAGE("Requested color buffer format ", GetTextureFormatAttribs(m_SwapChainDesc.ColorBufferFormat).Name, "is not supported by the surface");
            }
        }
    }

    VkSurfaceCapabilitiesKHR surfCapabilities = {};

    err = vkGetPhysicalDeviceSurfaceCapabilitiesKHR(vkDeviceHandle, m_VkSurface, &surfCapabilities);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query physical device surface capabilities");

    uint32_t presentModeCount = 0;

    err = vkGetPhysicalDeviceSurfacePresentModesKHR(vkDeviceHandle, m_VkSurface, &presentModeCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query surface present mode count");
    VERIFY_EXPR(presentModeCount > 0);
    std::vector<VkPresentModeKHR> presentModes(presentModeCount);
    err = vkGetPhysicalDeviceSurfacePresentModesKHR(vkDeviceHandle, m_VkSurface, &presentModeCount, presentModes.data());
    CHECK_VK_ERROR_AND_THROW(err, "Failed to query surface present modes");
    VERIFY_EXPR(presentModeCount == presentModes.size());


    VkSurfaceTransformFlagBitsKHR vkPreTransform = VK_SURFACE_TRANSFORM_IDENTITY_BIT_KHR;
    if (m_DesiredPreTransform != SURFACE_TRANSFORM_OPTIMAL)
    {
        vkPreTransform = SurfaceTransformToVkSurfaceTransformFlag(m_DesiredPreTransform);
        if ((surfCapabilities.supportedTransforms & vkPreTransform) != 0)
        {
            m_SwapChainDesc.PreTransform = m_DesiredPreTransform;
        }
        else
        {
            LOG_WARNING_MESSAGE(GetSurfaceTransformString(m_DesiredPreTransform),
                                " is not supported by the presentation engine. Optimal surface transform will be used instead."
                                " Query the swap chain description to get the actual surface transform.");
            m_DesiredPreTransform = SURFACE_TRANSFORM_OPTIMAL;
        }
    }

    if (m_DesiredPreTransform == SURFACE_TRANSFORM_OPTIMAL)
    {
        // Use current surface transform to avoid extra cost of presenting the image.
        // If preTransform does not match the currentTransform value returned by vkGetPhysicalDeviceSurfaceCapabilitiesKHR,
        // the presentation engine will transform the image content as part of the presentation operation.
        // https://android-developers.googleblog.com/2020/02/handling-device-orientation-efficiently.html
        // https://community.arm.com/developer/tools-software/graphics/b/blog/posts/appropriate-use-of-surface-rotation
        vkPreTransform               = surfCapabilities.currentTransform;
        m_SwapChainDesc.PreTransform = VkSurfaceTransformFlagToSurfaceTransform(vkPreTransform);
        LOG_INFO_MESSAGE("Using ", GetSurfaceTransformString(m_SwapChainDesc.PreTransform), " swap chain pretransform");
    }

    VkExtent2D swapchainExtent = {};
    // width and height are either both 0xFFFFFFFF, or both not 0xFFFFFFFF.
    if (surfCapabilities.currentExtent.width == 0xFFFFFFFF && m_SwapChainDesc.Width != 0 && m_SwapChainDesc.Height != 0)
    {
        // If the surface size is undefined, the size is set to
        // the size of the images requested.
        swapchainExtent.width  = std::min(std::max(m_SwapChainDesc.Width, surfCapabilities.minImageExtent.width), surfCapabilities.maxImageExtent.width);
        swapchainExtent.height = std::min(std::max(m_SwapChainDesc.Height, surfCapabilities.minImageExtent.height), surfCapabilities.maxImageExtent.height);
    }
    else
    {
        // If the surface size is defined, the swap chain size must match
        swapchainExtent = surfCapabilities.currentExtent;
    }

#if PLATFORM_ANDROID
    // On Android, vkGetPhysicalDeviceSurfaceCapabilitiesKHR is not reliable and starts reporting incorrect
    // dimensions after few rotations. To alleviate the problem, we store the surface extent corresponding to
    // identity rotation.
    // https://android-developers.googleblog.com/2020/02/handling-device-orientation-efficiently.html
    if (m_SurfaceIdentityExtent.width == 0 || m_SurfaceIdentityExtent.height == 0)
    {
        m_SurfaceIdentityExtent = surfCapabilities.currentExtent;
        constexpr auto Rotate90TransformFlags =
            VK_SURFACE_TRANSFORM_ROTATE_90_BIT_KHR |
            VK_SURFACE_TRANSFORM_ROTATE_270_BIT_KHR |
            VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_90_BIT_KHR |
            VK_SURFACE_TRANSFORM_HORIZONTAL_MIRROR_ROTATE_270_BIT_KHR;
        if ((surfCapabilities.currentTransform & Rotate90TransformFlags) != 0)
            std::swap(m_SurfaceIdentityExtent.width, m_SurfaceIdentityExtent.height);
    }

    if (m_DesiredPreTransform == SURFACE_TRANSFORM_OPTIMAL)
    {
        swapchainExtent = m_SurfaceIdentityExtent;
    }
    m_CurrentSurfaceTransform = surfCapabilities.currentTransform;
#endif

    swapchainExtent.width  = std::max(swapchainExtent.width, 1u);
    swapchainExtent.height = std::max(swapchainExtent.height, 1u);
    m_SwapChainDesc.Width  = swapchainExtent.width;
    m_SwapChainDesc.Height = swapchainExtent.height;

    // The FIFO present mode is guaranteed by the spec to always be supported.
    VkPresentModeKHR PresentMode = VK_PRESENT_MODE_FIFO_KHR;
    {
        std::vector<VkPresentModeKHR> PreferredPresentModes;
        if (m_VSyncEnabled)
        {
            // FIFO relaxed waits for the next VSync, but if the frame is late,
            // it still shows it even if VSync has already passed, which may
            // result in tearing.
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_RELAXED_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_KHR);
        }
        else
        {
            // Mailbox is the lowest latency non-tearing presentation mode.
            PreferredPresentModes.push_back(VK_PRESENT_MODE_MAILBOX_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_IMMEDIATE_KHR);
            PreferredPresentModes.push_back(VK_PRESENT_MODE_FIFO_KHR);
        }

        for (VkPresentModeKHR PreferredMode : PreferredPresentModes)
        {
            if (std::find(presentModes.begin(), presentModes.end(), PreferredMode) != presentModes.end())
            {
                PresentMode = PreferredMode;
                break;
            }
        }

        const char* PresentModeName = nullptr;
#define PRESENT_MODE_CASE(Mode) \
    case Mode: PresentModeName = #Mode; break;
        switch (PresentMode)
        {
            PRESENT_MODE_CASE(VK_PRESENT_MODE_IMMEDIATE_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_MAILBOX_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_FIFO_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_FIFO_RELAXED_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_SHARED_DEMAND_REFRESH_KHR)
            PRESENT_MODE_CASE(VK_PRESENT_MODE_SHARED_CONTINUOUS_REFRESH_KHR)
            default: PresentModeName = "<UNKNOWN>";
        }
#undef PRESENT_MODE_CASE
        LOG_INFO_MESSAGE("Using ", PresentModeName, " swap chain present mode");
    }

    // Determine the number of VkImage's to use in the swap chain.
    // We need to acquire only 1 presentable image at at time.
    // Asking for minImageCount images ensures that we can acquire
    // 1 presentable image as long as we present it before attempting
    // to acquire another.
    if (m_DesiredBufferCount < surfCapabilities.minImageCount)
    {
        LOG_INFO_MESSAGE("Desired back buffer count (", m_DesiredBufferCount, ") is smaller than the minimal image count supported for this surface (", surfCapabilities.minImageCount, "). Resetting to ", surfCapabilities.minImageCount);
        m_DesiredBufferCount = surfCapabilities.minImageCount;
    }
    if (surfCapabilities.maxImageCount != 0 && m_DesiredBufferCount > surfCapabilities.maxImageCount)
    {
        LOG_INFO_MESSAGE("Desired back buffer count (", m_DesiredBufferCount, ") is greater than the maximal image count supported for this surface (", surfCapabilities.maxImageCount, "). Resetting to ", surfCapabilities.maxImageCount);
        m_DesiredBufferCount = surfCapabilities.maxImageCount;
    }
    // We must use m_DesiredBufferCount instead of m_SwapChainDesc.BufferCount, because Vulkan on Android
    // may decide to always add extra buffers, causing infinite growth of the swap chain when it is recreated:
    //                          m_SwapChainDesc.BufferCount
    // CreateVulkanSwapChain()          2 -> 4
    // CreateVulkanSwapChain()          4 -> 6
    // CreateVulkanSwapChain()          6 -> 8
    uint32_t desiredNumberOfSwapChainImages = m_DesiredBufferCount;

    // Find a supported composite alpha mode - one of these is guaranteed to be set
    VkCompositeAlphaFlagBitsKHR compositeAlpha         = VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR;
    VkCompositeAlphaFlagBitsKHR compositeAlphaFlags[4] = //
        {
            VK_COMPOSITE_ALPHA_OPAQUE_BIT_KHR,
            VK_COMPOSITE_ALPHA_PRE_MULTIPLIED_BIT_KHR,
            VK_COMPOSITE_ALPHA_POST_MULTIPLIED_BIT_KHR,
            VK_COMPOSITE_ALPHA_INHERIT_BIT_KHR,
        };
    for (uint32_t i = 0; i < _countof(compositeAlphaFlags); i++)
    {
        if (surfCapabilities.supportedCompositeAlpha & compositeAlphaFlags[i])
        {
            compositeAlpha = compositeAlphaFlags[i];
            break;
        }
    }

    VkSwapchainKHR oldSwapchain = m_VkSwapChain;
    m_VkSwapChain               = VK_NULL_HANDLE;

    VkSwapchainCreateInfoKHR swapchain_ci = {};

    swapchain_ci.sType              = VK_STRUCTURE_TYPE_SWAPCHAIN_CREATE_INFO_KHR;
    swapchain_ci.pNext              = NULL;
    swapchain_ci.surface            = m_VkSurface;
    swapchain_ci.minImageCount      = desiredNumberOfSwapChainImages;
    swapchain_ci.imageFormat        = m_VkColorFormat;
    swapchain_ci.imageExtent.width  = swapchainExtent.width;
    swapchain_ci.imageExtent.height = swapchainExtent.height;
    swapchain_ci.preTransform       = vkPreTransform;
    swapchain_ci.compositeAlpha     = compositeAlpha;
    swapchain_ci.imageArrayLayers   = 1;
    swapchain_ci.presentMode        = PresentMode;
    swapchain_ci.oldSwapchain       = oldSwapchain;
    swapchain_ci.clipped            = VK_TRUE;
    swapchain_ci.imageColorSpace    = ColorSpace;

    DEV_CHECK_ERR(m_SwapChainDesc.Usage != 0, "No swap chain usage flags defined");
    static_assert(SWAP_CHAIN_USAGE_LAST == 8, "Please update this function to handle the new swapchain usage");
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_RENDER_TARGET)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_DST_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_SHADER_RESOURCE)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_SAMPLED_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_INPUT_ATTACHMENT)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_INPUT_ATTACHMENT_BIT;
    if (m_SwapChainDesc.Usage & SWAP_CHAIN_USAGE_COPY_SOURCE)
        swapchain_ci.imageUsage |= VK_IMAGE_USAGE_TRANSFER_SRC_BIT;

    // vkCmdClearColorImage() command requires the image to use VK_IMAGE_LAYOUT_TRANSFER_DST_OPTIMAL layout
    // that requires  VK_IMAGE_USAGE_TRANSFER_DST_BIT to be set
    swapchain_ci.imageSharingMode      = VK_SHARING_MODE_EXCLUSIVE;
    swapchain_ci.queueFamilyIndexCount = 0;
    swapchain_ci.pQueueFamilyIndices   = NULL;
    //uint32_t queueFamilyIndices[] = { (uint32_t)info.graphics_queue_family_index, (uint32_t)info.present_queue_family_index };
    //if (info.graphics_queue_family_index != info.present_queue_family_index) {
    //    // If the graphics and present queues are from different queue families,
    //    // we either have to explicitly transfer ownership of images between
    //    // the queues, or we have to create the swapchain with imageSharingMode
    //    // as VK_SHARING_MODE_CONCURRENT
    //    swapchain_ci.imageSharingMode = VK_SHARING_MODE_CONCURRENT;
    //    swapchain_ci.queueFamilyIndexCount = 2;
    //    swapchain_ci.pQueueFamilyIndices = queueFamilyIndices;
    //}

    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = pRenderDeviceVk->GetLogicalDevice();
    VkDevice                                    vkDevice      = pRenderDeviceVk->GetVkDevice();

    err = vkCreateSwapchainKHR(vkDevice, &swapchain_ci, NULL, &m_VkSwapChain);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to create Vulkan swapchain");

    if (oldSwapchain != VK_NULL_HANDLE)
    {
        vkDestroySwapchainKHR(vkDevice, oldSwapchain, NULL);
        oldSwapchain = VK_NULL_HANDLE;
    }

    uint32_t swapchainImageCount = 0;

    err = vkGetSwapchainImagesKHR(vkDevice, m_VkSwapChain, &swapchainImageCount, NULL);
    CHECK_VK_ERROR_AND_THROW(err, "Failed to request swap chain image count");
    VERIFY_EXPR(swapchainImageCount > 0);
    if (swapchainImageCount != m_SwapChainDesc.BufferCount)
    {
        LOG_INFO_MESSAGE("Created swap chain with ", swapchainImageCount,
                         " images vs ", m_SwapChainDesc.BufferCount, " requested.");
        m_SwapChainDesc.BufferCount = swapchainImageCount;
    }

    m_ImageAcquiredSemaphores.resize(swapchainImageCount);
    m_DrawCompleteSemaphores.resize(swapchainImageCount);
    for (uint32_t i = 0; i < swapchainImageCount; ++i)
    {
        VkSemaphoreCreateInfo SemaphoreCI = {};

        SemaphoreCI.sType = VK_STRUCTURE_TYPE_SEMAPHORE_CREATE_INFO;
        SemaphoreCI.pNext = nullptr;
        SemaphoreCI.flags = 0; // reserved for future use

        {
            std::stringstream ss;
            ss << "Swap chain image acquired semaphore " << i;
            const std::string                 Name      = ss.str();
            VulkanUtilities::SemaphoreWrapper Semaphore = LogicalDevice.CreateSemaphore(SemaphoreCI, Name.c_str());
            ManagedSemaphore::Create(pRenderDeviceVk, std::move(Semaphore), Name.c_str(), &m_ImageAcquiredSemaphores[i]);
        }

        {
            std::stringstream ss;
            ss << "Swap chain draw complete semaphore " << i;
            const std::string                 Name      = ss.str();
            VulkanUtilities::SemaphoreWrapper Semaphore = LogicalDevice.CreateSemaphore(SemaphoreCI, Name.c_str());
            ManagedSemaphore::Create(pRenderDeviceVk, std::move(Semaphore), Name.c_str(), &m_DrawCompleteSemaphores[i]);
        }
    }
}